

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextInput::matchLits(AspifTextInput *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  AspifTextInput *in_RDI;
  RuleBuilder *unaff_retaddr;
  bool in_stack_0000005f;
  char *in_stack_00000060;
  AspifTextInput *in_stack_00000068;
  undefined8 in_stack_ffffffffffffffe8;
  AspifTextInput *pAVar4;
  
  pAVar4 = in_RDI;
  bVar1 = ProgramReader::peek(&in_RDI->super_ProgramReader,
                              SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
  iVar3 = islower((uint)bVar1);
  if (iVar3 != 0) {
    do {
      matchLit(in_RDI);
      RuleBuilder::addGoal(unaff_retaddr,(Lit_t)((ulong)pAVar4 >> 0x20));
      bVar2 = match(in_stack_00000068,in_stack_00000060,in_stack_0000005f);
    } while (bVar2);
  }
  return;
}

Assistant:

void AspifTextInput::matchLits() {
	if (std::islower(static_cast<unsigned char>(peek(true))) != 0) {
		do {
			data_->rule.addGoal(matchLit());
		} while (match(",", false));
	}
}